

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::SubpassDescription::SubpassDescription(SubpassDescription *this,SubpassDescription *rhs)

{
  SubpassDescription *rhs_local;
  SubpassDescription *this_local;
  
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_inputAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_colorAttachments);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&this->m_resolveAttachments);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_preserveAttachments);
  operator=(this,rhs);
  return;
}

Assistant:

SubpassDescription::SubpassDescription (const SubpassDescription& rhs) {
	*this = rhs;
}